

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kx.h
# Opt level: O0

int hydro_kx_kk_3(hydro_kx_state *state,hydro_kx_session_keypair *kp,uint8_t *packet2,
                 hydro_kx_keypair *static_kp)

{
  int iVar1;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  hydro_kx_state *in_RDI;
  uint8_t *packet2_mac;
  uint8_t *peer_eph_pk;
  size_t in_stack_00000050;
  uint8_t *in_stack_00000058;
  uint8_t *in_stack_00000060;
  hydro_kx_state *in_stack_00000068;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  hydro_hash_update((hydro_hash_state *)packet2_mac,
                    (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    (size_t)in_RDI);
  iVar1 = hydro_kx_dh((hydro_kx_state *)
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (uint8_t *)in_RDI,in_RSI);
  if ((iVar1 == 0) &&
     (iVar1 = hydro_kx_dh((hydro_kx_state *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (uint8_t *)in_RDI,in_RSI), iVar1 == 0)) {
    iVar1 = hydro_kx_aead_decrypt
                      (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050);
    if (iVar1 != 0) {
      return -1;
    }
    hydro_kx_final(in_RDI,in_RSI,in_RDX);
    return 0;
  }
  return -1;
}

Assistant:

int
hydro_kx_kk_3(hydro_kx_state *state, hydro_kx_session_keypair *kp,
              const uint8_t packet2[hydro_kx_KK_PACKET2BYTES], const hydro_kx_keypair *static_kp)
{
    const uint8_t *peer_eph_pk = packet2;
    const uint8_t *packet2_mac = &packet2[hydro_kx_PUBLICKEYBYTES];

    hydro_hash_update(&state->h_st, peer_eph_pk, hydro_kx_PUBLICKEYBYTES);
    if (hydro_kx_dh(state, state->eph_kp.sk, peer_eph_pk) != 0 ||
        hydro_kx_dh(state, static_kp->sk, peer_eph_pk) != 0) {
        return -1;
    }

    if (hydro_kx_aead_decrypt(state, NULL, packet2_mac, hydro_kx_AEAD_MACBYTES) != 0) {
        return -1;
    }
    hydro_kx_final(state, kp->rx, kp->tx);

    return 0;
}